

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O1

int uv_fs_poll_start(uv_fs_poll_t *handle,uv_fs_poll_cb cb,char *path,uint interval)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *loop;
  int iVar3;
  size_t sVar4;
  undefined8 *ptr;
  uint64_t uVar5;
  
  iVar3 = 0;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    sVar4 = strlen(path);
    ptr = (undefined8 *)uv__calloc(1,sVar4 + 800);
    if (ptr == (undefined8 *)0x0) {
      iVar3 = -0xc;
    }
    else {
      ptr[3] = loop;
      ptr[4] = cb;
      *(uint *)((long)ptr + 0xc) = interval + (interval == 0);
      uVar5 = uv_now(loop);
      ptr[2] = uVar5;
      *ptr = handle;
      memcpy(ptr + 99,path,sVar4 + 1);
      iVar3 = uv_timer_init(loop,(uv_timer_t *)(ptr + 5));
      if (-1 < iVar3) {
        uVar2 = *(uint *)(ptr + 0x10);
        *(uint *)(ptr + 0x10) = uVar2 | 0x10;
        if (((uVar2 & 8) != 0) &&
           (*(uint *)(ptr + 0x10) = uVar2 & 0xfffffff7 | 0x10, (uVar2 & 5) == 4)) {
          *(int *)(ptr[6] + 8) = *(int *)(ptr[6] + 8) + -1;
        }
        iVar3 = uv_fs_stat(loop,(uv_fs_t *)(ptr + 0x18),(char *)(ptr + 99),poll_cb);
        if (-1 < iVar3) {
          handle->poll_ctx = ptr;
          uVar2 = handle->flags;
          if ((uVar2 & 4) != 0) {
            return 0;
          }
          handle->flags = uVar2 | 4;
          if ((uVar2 & 8) == 0) {
            return 0;
          }
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
          return 0;
        }
      }
      uv__free(ptr);
    }
  }
  return iVar3;
}

Assistant:

int uv_fs_poll_start(uv_fs_poll_t* handle,
                     uv_fs_poll_cb cb,
                     const char* path,
                     unsigned int interval) {
  struct poll_ctx* ctx;
  uv_loop_t* loop;
  size_t len;
  int err;

  if (uv__is_active(handle))
    return 0;

  loop = handle->loop;
  len = strlen(path);
  ctx = uv__calloc(1, sizeof(*ctx) + len);

  if (ctx == NULL)
    return UV_ENOMEM;

  ctx->loop = loop;
  ctx->poll_cb = cb;
  ctx->interval = interval ? interval : 1;
  ctx->start_time = uv_now(loop);
  ctx->parent_handle = handle;
  memcpy(ctx->path, path, len + 1);

  err = uv_timer_init(loop, &ctx->timer_handle);
  if (err < 0)
    goto error;

  ctx->timer_handle.flags |= UV_HANDLE_INTERNAL;
  uv__handle_unref(&ctx->timer_handle);

  err = uv_fs_stat(loop, &ctx->fs_req, ctx->path, poll_cb);
  if (err < 0)
    goto error;

  handle->poll_ctx = ctx;
  uv__handle_start(handle);

  return 0;

error:
  uv__free(ctx);
  return err;
}